

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QAnimationTimer::startAnimations(QAnimationTimer *this)

{
  QUnifiedTimer *this_00;
  
  if (this[0x25] == (QAnimationTimer)0x1) {
    this[0x25] = (QAnimationTimer)0x0;
    this_00 = QUnifiedTimer::instance();
    QUnifiedTimer::maybeUpdateAnimationsToCurrentTime((QUnifiedTimer *)this_00);
    QList<QAbstractAnimation_*>::append
              ((QList<QAbstractAnimation_*> *)(this + 0x28),
               (QList<QAbstractAnimation_*> *)(this + 0x40));
    QList<QAbstractAnimation_*>::clear((QList<QAbstractAnimation_*> *)(this + 0x40));
    if (*(long *)(this + 0x38) != 0) {
      (**(code **)(*(long *)this + 0x68))(this);
      return;
    }
  }
  return;
}

Assistant:

void QAnimationTimer::startAnimations()
{
    if (!startAnimationPending)
        return;
    startAnimationPending = false;

    //force timer to update, which prevents large deltas for our newly added animations
    QUnifiedTimer::instance()->maybeUpdateAnimationsToCurrentTime();

    //we transfer the waiting animations into the "really running" state
    animations += animationsToStart;
    animationsToStart.clear();
    if (!animations.isEmpty())
        restartAnimationTimer();
}